

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::MoveAndResize(Window *this,int x,int y,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->width;
  iVar2 = this->height;
  this->x = x;
  this->y = y;
  iVar3 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x1c])();
  iVar4 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x1d])(this);
  if ((((iVar1 == width) && (iVar2 == height)) && (iVar3 == this->lastAbsoluteX)) &&
     (((iVar4 == this->lastAbsoluteY && (this->badBounds == false)) &&
      (this->content != (WINDOW *)0x0)))) {
    DestroyIfBadBounds(this);
    return;
  }
  this->lastAbsoluteX = iVar3;
  this->lastAbsoluteY = iVar4;
  this->width = width;
  this->height = height;
  if (this->isVisibleInParent == true) {
    RecreateForUpdatedDimensions(this);
    return;
  }
  return;
}

Assistant:

void Window::MoveAndResize(int x, int y, int width, int height) {
    ASSERT_MAIN_THREAD();

    bool sizeChanged = this->width != width || this->height != height;

    this->x = x;
    this->y = y;
    int absX = this->GetAbsoluteX();
    int absY = this->GetAbsoluteY();

    bool positionChanged =
        absX != this->lastAbsoluteX ||
        absY != this->lastAbsoluteY;

    if (sizeChanged || positionChanged || this->badBounds || !this->content) {
        this->lastAbsoluteX = absX;
        this->lastAbsoluteY = absY;
        this->width = width;
        this->height = height;
        if (this->isVisibleInParent) {
            this->RecreateForUpdatedDimensions();
        }
    }
    else {
        this->DestroyIfBadBounds();
    }
}